

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# direct_lower_upper_factorisation.hpp
# Opt level: O0

void __thiscall
Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_false>::initialise_solver
          (Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_false> *this,
          Solver_Config config)

{
  ostream *poVar1;
  source_location *in_RCX;
  undefined **local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined **local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_false> *local_10;
  Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_false> *this_local;
  
  local_10 = this;
  if (config.type != lower_upper_factorisation) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"\n");
    local_38 = &PTR_s__workspace_llm4binary_github_lic_001b68b8;
    console_format_abi_cxx11_(&local_30,(Disa *)0x0,(Log_Level)&local_38,in_RCX);
    poVar1 = std::operator<<(poVar1,(string *)&local_30);
    poVar1 = std::operator<<(poVar1,"Miss-match between config tpye and LU/LUP selection.");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_30);
    exit(1);
  }
  if (((undefined1  [48])config & (undefined1  [48])0x100000000) != (undefined1  [48])0x0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"\n");
    local_70 = &PTR_s__workspace_llm4binary_github_lic_001b68d0;
    console_format_abi_cxx11_(&local_68,(Disa *)0x0,(Log_Level)&local_70,in_RCX);
    poVar1 = std::operator<<(poVar1,(string *)&local_68);
    poVar1 = std::operator<<(poVar1,"Miss-match between config pivoting and LU/LUP selection.");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_68);
    exit(1);
  }
  this->factorisation_tolerance = config.factor_tolerance;
  return;
}

Assistant:

void initialise_solver(Solver_Config config) {
    ASSERT(config.type == _solver_type, "Miss-match between config tpye and LU/LUP selection.");
    ASSERT(config.pivot == _pivot, "Miss-match between config pivoting and LU/LUP selection.");
    factorisation_tolerance = config.factor_tolerance;
  }